

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md4c.c
# Opt level: O1

int md_process_table_cell
              (MD_CTX *ctx,MD_BLOCKTYPE cell_type,MD_ALIGN align,MD_OFFSET beg,MD_OFFSET end)

{
  int iVar1;
  byte *pbVar2;
  _func_void_char_ptr_void_ptr *p_Var3;
  ulong uVar4;
  void *pvVar5;
  char *pcVar6;
  MD_OFFSET MVar7;
  MD_BLOCK_TD_DETAIL det;
  MD_LINE line;
  MD_ALIGN local_24;
  MD_LINE local_20;
  
  uVar4 = (ulong)beg;
  if (beg < end) {
    uVar4 = (ulong)beg;
    do {
      if ((0x20 < (ulong)(byte)ctx->text[uVar4]) ||
         ((0x100001a00U >> ((ulong)(byte)ctx->text[uVar4] & 0x3f) & 1) == 0)) goto LAB_0010a45f;
      uVar4 = uVar4 + 1;
    } while (end != uVar4);
    uVar4 = (ulong)end;
  }
LAB_0010a45f:
  local_20.beg = (MD_OFFSET)uVar4;
  local_20.end = end;
  if (local_20.beg < end) {
    pbVar2 = (byte *)(ctx->text + (end - 1));
    MVar7 = end;
    do {
      local_20.end = MVar7;
      if ((0x20 < (ulong)*pbVar2) || ((0x100001a00U >> ((ulong)*pbVar2 & 0x3f) & 1) == 0)) break;
      MVar7 = local_20.end - 1;
      pbVar2 = pbVar2 + -1;
      local_20.end = local_20.beg;
    } while (local_20.beg < MVar7);
  }
  local_24 = align;
  iVar1 = (*(ctx->parser).enter_block)(cell_type,&local_24,ctx->userdata);
  if (iVar1 == 0) {
    iVar1 = md_process_normal_block_contents(ctx,&local_20,1);
    if (iVar1 < 0) {
      return iVar1;
    }
    iVar1 = (*(ctx->parser).leave_block)(cell_type,&local_24,ctx->userdata);
    if (iVar1 == 0) {
      return 0;
    }
    p_Var3 = (ctx->parser).debug_log;
    if (p_Var3 == (_func_void_char_ptr_void_ptr *)0x0) {
      return iVar1;
    }
    pvVar5 = ctx->userdata;
    pcVar6 = "Aborted from leave_block() callback.";
  }
  else {
    p_Var3 = (ctx->parser).debug_log;
    if (p_Var3 == (_func_void_char_ptr_void_ptr *)0x0) {
      return iVar1;
    }
    pvVar5 = ctx->userdata;
    pcVar6 = "Aborted from enter_block() callback.";
  }
  (*p_Var3)(pcVar6,pvVar5);
  return iVar1;
}

Assistant:

static int
md_process_table_cell(MD_CTX* ctx, MD_BLOCKTYPE cell_type, MD_ALIGN align, OFF beg, OFF end)
{
    MD_LINE line;
    MD_BLOCK_TD_DETAIL det;
    int ret = 0;

    while(beg < end  &&  ISWHITESPACE(beg))
        beg++;
    while(end > beg  &&  ISWHITESPACE(end-1))
        end--;

    det.align = align;
    line.beg = beg;
    line.end = end;

    MD_ENTER_BLOCK(cell_type, &det);
    MD_CHECK(md_process_normal_block_contents(ctx, &line, 1));
    MD_LEAVE_BLOCK(cell_type, &det);

abort:
    return ret;
}